

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

ScalarFunction *
duckdb::SubtractFunction::GetFunction(ScalarFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType varargs;
  BaseScalarFunction *this;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  undefined4 in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca4;
  FunctionNullHandling FVar1;
  bind_lambda_function_t in_stack_fffffffffffffcb8;
  LogicalType local_340;
  scalar_function_t local_328;
  _Any_data local_308;
  code *local_2f8;
  undefined8 uStack_2f0;
  _Any_data local_2e0;
  code *local_2d0;
  LogicalType local_2c0;
  vector<duckdb::LogicalType,_true> local_2a8;
  LogicalType local_290;
  vector<duckdb::LogicalType,_true> local_278;
  LogicalType local_260;
  vector<duckdb::LogicalType,_true> local_248;
  string local_230;
  string local_210;
  string local_1f0;
  LogicalType local_1d0;
  LogicalType local_1b8;
  LogicalType local_1a0;
  BaseScalarFunction local_188;
  BaseScalarFunction local_d8;
  
  if (type->id_ == DECIMAL) {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"-","");
    LogicalType::LogicalType(&local_340,type);
    __l_00._M_len = 1;
    __l_00._M_array = &local_340;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_278,
               __l_00,(allocator_type *)&stack0xfffffffffffffcbf);
    LogicalType::LogicalType(&local_290,type);
    local_2f8 = (code *)0x0;
    uStack_2f0 = 0;
    local_308._M_unused._M_object = (void *)0x0;
    local_308._8_8_ = 0;
    FVar1 = 0x6c;
    LogicalType::LogicalType(&local_1b8,INVALID);
    ScalarFunction::ScalarFunction
              (__return_storage_ptr__,&local_210,&local_278,&local_290,
               (scalar_function_t *)&local_308,DecimalNegateBind,
               (bind_scalar_function_extended_t)0x0,NegateBindStatistics,(init_local_state_t)0x0,
               (LogicalType)ZEXT824(&local_1b8),CONSISTENT,FVar1,in_stack_fffffffffffffcb8);
    LogicalType::~LogicalType(&local_1b8);
    if (local_2f8 != (code *)0x0) {
      (*local_2f8)(&local_308,&local_308,__destroy_functor);
    }
    LogicalType::~LogicalType(&local_290);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_278);
    LogicalType::~LogicalType(&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  else {
    if (type->id_ == INTERVAL) {
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"-","");
      LogicalType::LogicalType(&local_340,type);
      __l._M_len = 1;
      __l._M_array = &local_340;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_248,__l
                 ,(allocator_type *)&stack0xfffffffffffffcbf);
      LogicalType::LogicalType(&local_260,type);
      local_328.super__Function_base._M_functor._8_8_ = 0;
      local_328.super__Function_base._M_functor._M_unused._M_object =
           ScalarFunction::
           UnaryFunction<duckdb::interval_t,duckdb::interval_t,duckdb::NegateOperator>;
      local_328._M_invoker =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_invoke;
      local_328.super__Function_base._M_manager =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_manager;
      FVar1 = 0x21;
      LogicalType::LogicalType(&local_1a0,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_1a0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffc9c;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffca4;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_1f0,&local_248,&local_260,&local_328,
                 (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                 (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,FVar1,
                 in_stack_fffffffffffffcb8);
      LogicalType::~LogicalType(&local_1a0);
      if (local_328.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_328.super__Function_base._M_manager)
                  ((_Any_data *)&local_328,(_Any_data *)&local_328,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_260);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_248);
      LogicalType::~LogicalType(&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      BaseScalarFunction::SetReturnsError
                (&local_d8,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_d8;
    }
    else {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"-","");
      LogicalType::LogicalType(&local_340,type);
      __l_01._M_len = 1;
      __l_01._M_array = &local_340;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2a8,
                 __l_01,(allocator_type *)&stack0xfffffffffffffcbf);
      LogicalType::LogicalType(&local_2c0,type);
      ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>
                ((scalar_function_t *)&local_2e0,type);
      FVar1 = 0x9b;
      LogicalType::LogicalType(&local_1d0,INVALID);
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_230,&local_2a8,&local_2c0,
                 (scalar_function_t *)&local_2e0,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,NegateBindStatistics,(init_local_state_t)0x0,
                 (LogicalType)ZEXT824(&local_1d0),CONSISTENT,FVar1,in_stack_fffffffffffffcb8);
      LogicalType::~LogicalType(&local_1d0);
      if (local_2d0 != (code *)0x0) {
        (*local_2d0)(&local_2e0,&local_2e0,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_2c0);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2a8);
      LogicalType::~LogicalType(&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      BaseScalarFunction::SetReturnsError
                (&local_188,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_188;
    }
    BaseScalarFunction::~BaseScalarFunction(this);
  }
  return __return_storage_ptr__;
}

Assistant:

ScalarFunction SubtractFunction::GetFunction(const LogicalType &type) {
	if (type.id() == LogicalTypeId::INTERVAL) {
		ScalarFunction func("-", {type}, type, ScalarFunction::UnaryFunction<interval_t, interval_t, NegateOperator>);
		ScalarFunction::SetReturnsError(func);
		return func;
	} else if (type.id() == LogicalTypeId::DECIMAL) {
		ScalarFunction func("-", {type}, type, nullptr, DecimalNegateBind, nullptr, NegateBindStatistics);
		return func;
	} else {
		D_ASSERT(type.IsNumeric());
		ScalarFunction func("-", {type}, type, ScalarFunction::GetScalarUnaryFunction<NegateOperator>(type), nullptr,
		                    nullptr, NegateBindStatistics);
		ScalarFunction::SetReturnsError(func);
		return func;
	}
}